

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.cpp
# Opt level: O2

void __thiscall soplex::MPSInput::insertName(MPSInput *this,char *name,bool second)

{
  undefined3 in_register_00000011;
  char *pcVar1;
  
  this->m_f5 = this->m_f4;
  pcVar1 = this->m_f3;
  this->m_f3 = this->m_f2;
  this->m_f4 = pcVar1;
  pcVar1 = name;
  if (CONCAT31(in_register_00000011,second) == 0) {
    pcVar1 = this->m_f1;
    this->m_f1 = name;
  }
  this->m_f2 = pcVar1;
  return;
}

Assistant:

void MPSInput::insertName(const char* name, bool second)
{
   m_f5 = m_f4;
   m_f4 = m_f3;
   m_f3 = m_f2;

   if(second)
      m_f2 = name;
   else
   {
      m_f2 = m_f1;
      m_f1 = name;
   }
}